

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateZeroInitFields
          (MessageGenerator *this,Printer *p)

{
  bool bVar1;
  reference ppFVar2;
  FieldGenerator *this_00;
  byte local_69;
  FieldGenerator *generator;
  const_iterator end;
  const_iterator it;
  anon_class_24_3_f542e84b emit_pending_zero_fields;
  FieldDescriptor *first;
  Printer *p_local;
  MessageGenerator *this_local;
  
  emit_pending_zero_fields.p = (Printer **)0x0;
  it._M_current = (FieldDescriptor **)&emit_pending_zero_fields.p;
  emit_pending_zero_fields.this = (MessageGenerator *)&first;
  emit_pending_zero_fields.first = (FieldDescriptor **)this;
  first = (FieldDescriptor *)p;
  p_local = (Printer *)this;
  end = std::
        vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ::begin(&this->optimized_order_);
  generator = (FieldGenerator *)
              std::
              vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ::end(&this->optimized_order_);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&end,(__normal_iterator<const_google::protobuf::FieldDescriptor_*const_*,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                             *)&generator);
    local_69 = 0;
    if (bVar1) {
      ppFVar2 = __gnu_cxx::
                __normal_iterator<const_google::protobuf::FieldDescriptor_*const_*,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                ::operator*(&end);
      bVar1 = ShouldSplit(*ppFVar2,&this->options_);
      local_69 = bVar1 ^ 0xff;
    }
    if ((local_69 & 1) == 0) break;
    ppFVar2 = __gnu_cxx::
              __normal_iterator<const_google::protobuf::FieldDescriptor_*const_*,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
              ::operator*(&end);
    this_00 = FieldGeneratorTable::get(&this->field_generators_,*ppFVar2);
    bVar1 = FieldGenerator::has_trivial_zero_default(this_00);
    if (bVar1) {
      if (emit_pending_zero_fields.p == (Printer **)0x0) {
        ppFVar2 = __gnu_cxx::
                  __normal_iterator<const_google::protobuf::FieldDescriptor_*const_*,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                  ::operator*(&end);
        emit_pending_zero_fields.p = (Printer **)*ppFVar2;
      }
    }
    else {
      GenerateZeroInitFields::anon_class_24_3_f542e84b::operator()
                ((anon_class_24_3_f542e84b *)&it,(Iterator)end._M_current);
    }
    __gnu_cxx::
    __normal_iterator<const_google::protobuf::FieldDescriptor_*const_*,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
    ::operator++(&end);
  }
  GenerateZeroInitFields::anon_class_24_3_f542e84b::operator()
            ((anon_class_24_3_f542e84b *)&it,(Iterator)end._M_current);
  return;
}

Assistant:

void MessageGenerator::GenerateZeroInitFields(io::Printer* p) const {
  using Iterator = decltype(optimized_order_.begin());
  const FieldDescriptor* first = nullptr;
  auto emit_pending_zero_fields = [&](Iterator end) {
    if (first != nullptr) {
      const FieldDescriptor* last = end[-1];
      if (first != last ||
          !field_generators_.get(first).has_brace_default_assign()) {
        p->Emit({{"first", FieldName(first)},
                 {"last", FieldName(last)},
                 {"Impl", "Impl_"},
                 {"impl", "_impl_"}},
                R"cc(
                  ::memset(reinterpret_cast<char *>(&$impl$) +
                               offsetof($Impl$, $first$_),
                           0,
                           offsetof($Impl$, $last$_) -
                               offsetof($Impl$, $first$_) +
                               sizeof($Impl$::$last$_));
                )cc");
      } else {
        p->Emit({{"field", FieldMemberName(first, false)}},
                R"cc(
                  $field$ = {};
                )cc");
      }
      first = nullptr;
    }
  };

  auto it = optimized_order_.begin();
  auto end = optimized_order_.end();
  for (; it != end && !ShouldSplit(*it, options_); ++it) {
    auto const& generator = field_generators_.get(*it);
    if (generator.has_trivial_zero_default()) {
      if (first == nullptr) first = *it;
    } else {
      emit_pending_zero_fields(it);
    }
  }
  emit_pending_zero_fields(it);
}